

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

ivec_t * find_assoc(words_t *strs,ivec_t *pos)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pbVar4;
  reference pcVar5;
  reference pcVar6;
  reference pvVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  ivec_t hashed;
  int d;
  ivec_t hashed_1;
  int j;
  int i_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<char,_std::allocator<char>_> *__range2_1;
  int k;
  int assoc_best_val;
  int assoc_best;
  int i;
  char c;
  iterator __end2;
  iterator __begin2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> w;
  const_iterator __end1;
  const_iterator __begin1;
  words_t *__range1;
  vector<char,_std::allocator<char>_> useful_chars;
  int N;
  int current_dups;
  ivec_t *assoc;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  value_type in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  int iVar8;
  undefined4 in_stack_fffffffffffffedc;
  vector<char,_std::allocator<char>_> *t;
  vector<int,_std::allocator<int>_> local_f0;
  int local_d8;
  int local_d4;
  char *local_d0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_c8;
  undefined1 *local_c0;
  int iVar9;
  value_type vVar10;
  undefined4 in_stack_ffffffffffffff54;
  int iVar11;
  undefined4 in_stack_ffffffffffffff5c;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  string *local_90;
  string local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  undefined1 local_40 [28];
  int local_24;
  int local_20;
  byte local_19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  
  local_19 = 0;
  t = in_RDI;
  local_10 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10bc29);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_10);
  local_20 = (int)sVar3;
  local_24 = 0x7f;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x10bc55);
  local_48 = local_10;
  local_50._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffec8);
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffec8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffec8), bVar1) {
    pbVar4 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_50);
    std::__cxx11::string::string(local_78,(string *)pbVar4);
    local_90 = local_78;
    local_98._M_current = (char *)std::__cxx11::string::begin();
    std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                              (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_stack_fffffffffffffec8), bVar1) {
      pcVar5 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_98);
      in_stack_ffffffffffffff5c = CONCAT13(*pcVar5,(int3)in_stack_ffffffffffffff5c);
      bVar1 = has<std::vector<char,std::allocator<char>>,char>(t,(char *)in_RDI);
      in_stack_fffffffffffffedc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffedc);
      if (!bVar1) {
        std::vector<char,_std::allocator<char>_>::push_back
                  (in_RDI,(value_type_conflict *)
                          CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_98);
    }
    std::__cxx11::string::~string(local_78);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_50);
  }
  for (iVar11 = 0; iVar11 < local_24; iVar11 = iVar11 + 1) {
    in_stack_ffffffffffffff54 = 0;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (value_type_conflict1 *)in_stack_fffffffffffffec8);
  }
  vVar10 = -1;
  iVar2 = std::numeric_limits<int>::max();
  for (iVar9 = 0; iVar9 < 4; iVar9 = iVar9 + 1) {
    local_c0 = local_40;
    local_c8._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_fffffffffffffec8);
    local_d0 = (char *)std::vector<char,_std::allocator<char>_>::end(in_stack_fffffffffffffec8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                               *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                              (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                               *)in_stack_fffffffffffffec8), bVar1) {
      pcVar6 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&local_c8);
      local_d4 = (int)*pcVar6;
      iVar2 = std::numeric_limits<int>::max();
      in_stack_fffffffffffffed0 = vVar10;
      for (local_d8 = 0; local_d8 < 100; local_d8 = local_d8 + 1) {
        iVar8 = local_d8;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)in_RDI,(long)local_d4);
        *pvVar7 = iVar8;
        do_hash((words_t *)CONCAT44(in_stack_ffffffffffffff5c,iVar11),
                (ivec_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_fffffffffffffed0),
                (ivec_t *)CONCAT44(iVar2,iVar9));
        in_stack_fffffffffffffed4 = count_dups<int>(&local_f0);
        if (in_stack_fffffffffffffed4 < iVar2) {
          iVar2 = in_stack_fffffffffffffed4;
          in_stack_fffffffffffffed0 = local_d8;
        }
        std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)in_RDI)
        ;
      }
      vVar10 = in_stack_fffffffffffffed0;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)in_RDI,(long)local_d4);
      *pvVar7 = in_stack_fffffffffffffed0;
      __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                (&local_c8);
    }
    if (local_20 <= iVar2) break;
    local_20 = iVar2;
  }
  do_hash((words_t *)CONCAT44(in_stack_ffffffffffffff5c,iVar11),
          (ivec_t *)CONCAT44(in_stack_ffffffffffffff54,vVar10),(ivec_t *)CONCAT44(iVar2,iVar9));
  local_19 = 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)in_RDI);
  std::vector<char,_std::allocator<char>_>::~vector(in_RDI);
  if ((local_19 & 1) == 0) {
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)in_RDI);
  }
  return (ivec_t *)t;
}

Assistant:

static ivec_t find_assoc(const words_t &strs, const ivec_t &pos)
{
    ivec_t assoc;
    int current_dups = strs.size();
    int N = 127;
    std::vector<char> useful_chars;
    for(auto w:strs)
        for(auto c:w)
            if(!has(useful_chars, c))
                useful_chars.push_back(c);

    for(int i=0; i<N; ++i)
        assoc.push_back(0);

    int assoc_best = -1;
    int assoc_best_val = std::numeric_limits<int>::max();;
    for(int k=0; k<4; ++k)
    {
        for(int i:useful_chars) {
            assoc_best_val = std::numeric_limits<int>::max();
            for(int j=0; j<100; ++j) {
                //printf(".");
                assoc[i] = j;
                auto hashed = do_hash(strs, pos, assoc);
                //for(int i=0; i<hashed.size(); ++i)
                //    printf("%d ", hashed[i]);
                //printf("\n");
                int d = count_dups(hashed);
                //printf("dup %d\n",d);
                if(d < assoc_best_val) {
                    assoc_best_val = d;
                    assoc_best = j;
                }
            }
            assoc[i] = assoc_best;
        }
        if(assoc_best_val >= current_dups)
            break;
        current_dups = assoc_best_val;
    }
    auto hashed = do_hash(strs, pos, assoc);
    //int d = count_dups(hashed);
    //printf("Total Dups Assoc: %d\n", d);
    return assoc;
}